

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O1

char * Mio_LibDeriveSop(int nVars,Vec_Int_t *vExpr,Vec_Str_t *vStr)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  char *pcVar5;
  uint *__ptr;
  void *pvVar6;
  uint *puVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  uint *puVar10;
  uint *puVar11;
  uint *puVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint *puVar16;
  uint uVar17;
  uint uVar18;
  size_t sVar19;
  int i;
  long lVar20;
  long lVar21;
  
  vStr->nSize = 0;
  uVar9 = vExpr->nSize;
  if ((int)uVar9 < 1) goto LAB_008ae58f;
  if (*vExpr->pArray == -2) {
    lVar20 = 0;
    do {
      cVar1 = ".names n%0*d\n 1\n"[lVar20 + 0xd];
      uVar9 = vStr->nCap;
      if (vStr->nSize == uVar9) {
        if ((int)uVar9 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar19 = 0x10;
        }
        else {
          sVar19 = (ulong)uVar9 * 2;
          if ((int)sVar19 <= (int)uVar9) goto LAB_008adc9d;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar19);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar19);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar19;
      }
LAB_008adc9d:
      iVar13 = vStr->nSize;
      vStr->nSize = iVar13 + 1;
      vStr->pArray[iVar13] = cVar1;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
  }
  else {
    if (*vExpr->pArray != -1) {
      if (uVar9 != 1) {
        __ptr = (uint *)malloc(0x10);
        uVar14 = 8;
        if (6 < ((uVar9 >> 1) + nVars) - 1) {
          uVar14 = (uVar9 >> 1) + nVars;
        }
        __ptr[1] = 0;
        *__ptr = uVar14;
        if (uVar14 == 0) {
          pvVar6 = (void *)0x0;
        }
        else {
          pvVar6 = malloc((long)(int)uVar14 * 8);
        }
        *(void **)(__ptr + 2) = pvVar6;
        puVar7 = (uint *)malloc(0x10);
        puVar7[1] = 0;
        *puVar7 = uVar14;
        if (uVar14 == 0) {
          pvVar6 = (void *)0x0;
        }
        else {
          pvVar6 = malloc((long)(int)uVar14 << 3);
        }
        puVar10 = __ptr + 2;
        puVar16 = puVar7 + 2;
        *(void **)(puVar7 + 2) = pvVar6;
        if (0 < nVars) {
          iVar13 = 0;
          do {
            pVVar8 = Mio_SopVar0(iVar13);
            uVar9 = *__ptr;
            if (__ptr[1] == uVar9) {
              if ((int)uVar9 < 0x10) {
                if (*(void **)puVar10 == (void *)0x0) {
                  pvVar6 = malloc(0x80);
                }
                else {
                  pvVar6 = realloc(*(void **)puVar10,0x80);
                }
                uVar14 = 0x10;
              }
              else {
                uVar14 = uVar9 * 2;
                if ((int)uVar14 <= (int)uVar9) goto LAB_008adfbc;
                if (*(void **)puVar10 == (void *)0x0) {
                  pvVar6 = malloc((ulong)uVar9 << 4);
                }
                else {
                  pvVar6 = realloc(*(void **)puVar10,(ulong)uVar9 << 4);
                }
              }
              *(void **)(__ptr + 2) = pvVar6;
              *__ptr = uVar14;
            }
LAB_008adfbc:
            uVar9 = __ptr[1];
            __ptr[1] = uVar9 + 1;
            *(Vec_Int_t **)(*(long *)(__ptr + 2) + (long)(int)uVar9 * 8) = pVVar8;
            pVVar8 = Mio_SopVar1(iVar13);
            uVar9 = *puVar7;
            if (puVar7[1] == uVar9) {
              if ((int)uVar9 < 0x10) {
                if (*(void **)puVar16 == (void *)0x0) {
                  pvVar6 = malloc(0x80);
                }
                else {
                  pvVar6 = realloc(*(void **)puVar16,0x80);
                }
                uVar14 = 0x10;
              }
              else {
                uVar14 = uVar9 * 2;
                if ((int)uVar14 <= (int)uVar9) goto LAB_008ae041;
                if (*(void **)puVar16 == (void *)0x0) {
                  pvVar6 = malloc((ulong)uVar9 << 4);
                }
                else {
                  pvVar6 = realloc(*(void **)puVar16,(ulong)uVar9 << 4);
                }
              }
              *(void **)(puVar7 + 2) = pvVar6;
              *puVar7 = uVar14;
            }
LAB_008ae041:
            uVar9 = puVar7[1];
            puVar7[1] = uVar9 + 1;
            *(Vec_Int_t **)(*(long *)(puVar7 + 2) + (long)(int)uVar9 * 8) = pVVar8;
            iVar13 = iVar13 + 1;
          } while (nVars != iVar13);
        }
        uVar9 = vExpr->nSize;
        if (1 < (int)uVar9) {
          lVar21 = 1;
          lVar20 = 0;
          do {
            if (((long)(int)uVar9 <= lVar21 + -1) || ((int)uVar9 <= lVar21)) goto LAB_008ae58f;
            uVar9 = vExpr->pArray[lVar21 + -1];
            uVar15 = (int)uVar9 >> 1;
            uVar14 = vExpr->pArray[lVar21];
            if ((uVar9 & 1) == 0) {
              if ((int)uVar15 < 0) goto LAB_008ae570;
              uVar18 = puVar7[1];
              puVar11 = puVar16;
            }
            else {
              if ((int)uVar15 < 0) goto LAB_008ae570;
              uVar18 = __ptr[1];
              puVar11 = puVar10;
            }
            if ((int)uVar18 <= (int)uVar15) goto LAB_008ae570;
            uVar18 = (int)uVar14 >> 1;
            if ((uVar14 & 1) == 0) {
              if ((int)uVar18 < 0) goto LAB_008ae570;
              uVar3 = puVar7[1];
              puVar12 = puVar16;
            }
            else {
              if ((int)uVar18 < 0) goto LAB_008ae570;
              uVar3 = __ptr[1];
              puVar12 = puVar10;
            }
            if ((int)uVar3 <= (int)uVar18) goto LAB_008ae570;
            pVVar8 = Mio_SopCoverAnd(*(Vec_Int_t **)(*(long *)puVar11 + (ulong)uVar15 * 8),
                                     *(Vec_Int_t **)(*(long *)puVar12 + (ulong)uVar18 * 8));
            uVar3 = *puVar7;
            if (puVar7[1] == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (*(void **)puVar16 == (void *)0x0) {
                  pvVar6 = malloc(0x80);
                }
                else {
                  pvVar6 = realloc(*(void **)puVar16,0x80);
                }
                uVar17 = 0x10;
              }
              else {
                uVar17 = uVar3 * 2;
                if ((int)uVar17 <= (int)uVar3) goto LAB_008ae1f7;
                if (*(void **)puVar16 == (void *)0x0) {
                  pvVar6 = malloc((ulong)uVar3 << 4);
                }
                else {
                  pvVar6 = realloc(*(void **)puVar16,(ulong)uVar3 << 4);
                }
              }
              *(void **)(puVar7 + 2) = pvVar6;
              *puVar7 = uVar17;
            }
LAB_008ae1f7:
            uVar3 = puVar7[1];
            puVar7[1] = uVar3 + 1;
            *(Vec_Int_t **)(*(long *)(puVar7 + 2) + (long)(int)uVar3 * 8) = pVVar8;
            if ((uVar9 & 1) == 0) {
              if (((int)uVar15 < 0) || (puVar11 = puVar10, (int)__ptr[1] <= (int)uVar15))
              goto LAB_008ae570;
            }
            else if (((int)uVar15 < 0) || (puVar11 = puVar16, (int)uVar3 < (int)uVar15))
            goto LAB_008ae570;
            if ((uVar14 & 1) == 0) {
              if (((int)uVar18 < 0) || (puVar12 = puVar10, (int)__ptr[1] <= (int)uVar18)) {
LAB_008ae570:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
            }
            else if (((int)uVar18 < 0) || (puVar12 = puVar16, (int)uVar3 < (int)uVar18))
            goto LAB_008ae570;
            pVVar8 = Mio_SopCoverOr(*(Vec_Int_t **)(*(long *)puVar11 + (ulong)uVar15 * 8),
                                    *(Vec_Int_t **)(*(long *)puVar12 + (ulong)uVar18 * 8));
            uVar9 = *__ptr;
            if (__ptr[1] == uVar9) {
              if ((int)uVar9 < 0x10) {
                if (*(void **)puVar10 == (void *)0x0) {
                  pvVar6 = malloc(0x80);
                }
                else {
                  pvVar6 = realloc(*(void **)puVar10,0x80);
                }
                uVar14 = 0x10;
              }
              else {
                uVar14 = uVar9 * 2;
                if ((int)uVar14 <= (int)uVar9) goto LAB_008ae31d;
                if (*(void **)puVar10 == (void *)0x0) {
                  pvVar6 = malloc((ulong)uVar9 << 4);
                }
                else {
                  pvVar6 = realloc(*(void **)puVar10,(ulong)uVar9 << 4);
                }
              }
              *(void **)(__ptr + 2) = pvVar6;
              *__ptr = uVar14;
            }
LAB_008ae31d:
            uVar9 = __ptr[1];
            __ptr[1] = uVar9 + 1;
            *(Vec_Int_t **)(*(long *)(__ptr + 2) + (long)(int)uVar9 * 8) = pVVar8;
            lVar20 = lVar20 + 1;
            uVar9 = vExpr->nSize;
            lVar21 = lVar21 + 2;
          } while (lVar20 < (int)uVar9 / 2);
        }
        if ((int)uVar9 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
        }
        puVar16 = puVar7;
        if ((*(byte *)(vExpr->pArray + ((ulong)uVar9 - 1)) & 1) == 0) {
          puVar16 = __ptr;
          __ptr = puVar7;
        }
        if (((long)(int)puVar16[1] < 1) || ((long)(int)__ptr[1] < 1)) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
        }
        pVVar8 = *(Vec_Int_t **)(*(long *)(puVar16 + 2) + -8 + (long)(int)puVar16[1] * 8);
        pVVar4 = *(Vec_Int_t **)(*(long *)(__ptr + 2) + -8 + (long)(int)__ptr[1] * 8);
        if (pVVar4->nSize <= pVVar8->nSize) {
          pVVar8 = pVVar4;
        }
        Mio_SopDeriveFromArray(pVVar8,nVars,vStr,(uint)(pVVar8 == pVVar4));
        if (0 < (int)puVar16[1]) {
          lVar20 = 0;
          do {
            pvVar6 = *(void **)(*(long *)(puVar16 + 2) + lVar20 * 8);
            if (pvVar6 != (void *)0x0) {
              if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar6 + 8));
                *(undefined8 *)((long)pvVar6 + 8) = 0;
              }
              free(pvVar6);
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 < (int)puVar16[1]);
        }
        if (*(void **)(puVar16 + 2) != (void *)0x0) {
          free(*(void **)(puVar16 + 2));
          puVar16[2] = 0;
          puVar16[3] = 0;
        }
        free(puVar16);
        if (0 < (int)__ptr[1]) {
          lVar20 = 0;
          do {
            pvVar6 = *(void **)(*(long *)(__ptr + 2) + lVar20 * 8);
            if (pvVar6 != (void *)0x0) {
              if (*(void **)((long)pvVar6 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar6 + 8));
                *(undefined8 *)((long)pvVar6 + 8) = 0;
              }
              free(pvVar6);
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 < (int)__ptr[1]);
        }
        if (*(void **)(__ptr + 2) != (void *)0x0) {
          free(*(void **)(__ptr + 2));
          __ptr[2] = 0;
          __ptr[3] = 0;
        }
        free(__ptr);
        goto LAB_008ae55e;
      }
      iVar13 = nVars;
      if (0 < nVars) {
        do {
          uVar9 = vStr->nCap;
          if (vStr->nSize == uVar9) {
            if ((int)uVar9 < 0x10) {
              if (vStr->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(vStr->pArray,0x10);
              }
              vStr->pArray = pcVar5;
              sVar19 = 0x10;
            }
            else {
              sVar19 = (ulong)uVar9 * 2;
              if ((int)sVar19 <= (int)uVar9) goto LAB_008add7a;
              if (vStr->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(sVar19);
              }
              else {
                pcVar5 = (char *)realloc(vStr->pArray,sVar19);
              }
              vStr->pArray = pcVar5;
            }
            vStr->nCap = (int)sVar19;
          }
LAB_008add7a:
          iVar2 = vStr->nSize;
          vStr->nSize = iVar2 + 1;
          vStr->pArray[iVar2] = '-';
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      lVar20 = 0;
      do {
        cVar1 = ".names n%0*d\n 1\n"[lVar20 + 0xd];
        uVar9 = vStr->nCap;
        if (vStr->nSize == uVar9) {
          if ((int)uVar9 < 0x10) {
            if (vStr->pArray == (char *)0x0) {
              pcVar5 = (char *)malloc(0x10);
            }
            else {
              pcVar5 = (char *)realloc(vStr->pArray,0x10);
            }
            sVar19 = 0x10;
          }
          else {
            sVar19 = (ulong)uVar9 * 2;
            if ((int)sVar19 <= (int)uVar9) goto LAB_008addf7;
            if (vStr->pArray == (char *)0x0) {
              pcVar5 = (char *)malloc(sVar19);
            }
            else {
              pcVar5 = (char *)realloc(vStr->pArray,sVar19);
            }
          }
          vStr->pArray = pcVar5;
          vStr->nCap = (int)sVar19;
        }
LAB_008addf7:
        iVar13 = vStr->nSize;
        vStr->nSize = iVar13 + 1;
        vStr->pArray[iVar13] = cVar1;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 3);
      uVar9 = vStr->nCap;
      if (vStr->nSize == uVar9) {
        if ((int)uVar9 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          vStr->pArray = pcVar5;
          sVar19 = 0x10;
        }
        else {
          sVar19 = (ulong)uVar9 * 2;
          if ((int)sVar19 <= (int)uVar9) goto LAB_008ae515;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar19);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar19);
          }
          vStr->pArray = pcVar5;
        }
        vStr->nCap = (int)sVar19;
      }
LAB_008ae515:
      iVar13 = vStr->nSize;
      vStr->nSize = iVar13 + 1;
      vStr->pArray[iVar13] = '\0';
      if (vExpr->nSize < 1) {
LAB_008ae58f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar9 = *vExpr->pArray >> 1;
      if (nVars <= (int)uVar9) {
        __assert_fail("(Vec_IntEntry(vExpr,0) >> 1) < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioSop.c"
                      ,0x119,"char *Mio_LibDeriveSop(int, Vec_Int_t *, Vec_Str_t *)");
      }
      if (((int)uVar9 < 0) || (vStr->nSize <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      vStr->pArray[uVar9] = (byte)*vExpr->pArray & 1 ^ 0x31;
      goto LAB_008ae55e;
    }
    lVar20 = 0;
    do {
      cVar1 = " 0 0\n"[lVar20 + 2];
      uVar9 = vStr->nCap;
      if (vStr->nSize == uVar9) {
        if ((int)uVar9 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar19 = 0x10;
        }
        else {
          sVar19 = (ulong)uVar9 * 2;
          if ((int)sVar19 <= (int)uVar9) goto LAB_008adc0c;
          if (vStr->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar19);
          }
          else {
            pcVar5 = (char *)realloc(vStr->pArray,sVar19);
          }
        }
        vStr->pArray = pcVar5;
        vStr->nCap = (int)sVar19;
      }
LAB_008adc0c:
      iVar13 = vStr->nSize;
      vStr->nSize = iVar13 + 1;
      vStr->pArray[iVar13] = cVar1;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
  }
  uVar9 = vStr->nCap;
  if (vStr->nSize == uVar9) {
    if ((int)uVar9 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar5;
      sVar19 = 0x10;
    }
    else {
      sVar19 = (ulong)uVar9 * 2;
      if ((int)sVar19 <= (int)uVar9) goto LAB_008ae4d8;
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar19);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,sVar19);
      }
      vStr->pArray = pcVar5;
    }
    vStr->nCap = (int)sVar19;
  }
LAB_008ae4d8:
  iVar13 = vStr->nSize;
  vStr->nSize = iVar13 + 1;
  vStr->pArray[iVar13] = '\0';
LAB_008ae55e:
  return vStr->pArray;
}

Assistant:

char * Mio_LibDeriveSop( int nVars, Vec_Int_t * vExpr, Vec_Str_t * vStr )
{
    Vec_Int_t * vSop;
    Vec_Ptr_t * vSops0, * vSops1, * vTemp;
    int i, Index0, Index1, fCompl0, fCompl1;
    Vec_StrClear( vStr );
    if ( Exp_IsConst0(vExpr) )
    {
        Vec_StrPrintStr( vStr, " 0\n" );
        Vec_StrPush( vStr, '\0' );
        return Vec_StrArray( vStr );
    }
    if ( Exp_IsConst1(vExpr) )
    {
        Vec_StrPrintStr( vStr, " 1\n" );
        Vec_StrPush( vStr, '\0' );
        return Vec_StrArray( vStr );
    }
    if ( Exp_IsLit(vExpr) )
    {
        for ( i = 0; i < nVars; i++ )
            Vec_StrPush( vStr, '-' );
        Vec_StrPrintStr( vStr, " 1\n" );
        Vec_StrPush( vStr, '\0' );
        assert( (Vec_IntEntry(vExpr,0) >> 1) < nVars );
        Vec_StrWriteEntry( vStr, Vec_IntEntry(vExpr,0) >> 1, (char)('1' - (Vec_IntEntry(vExpr,0) & 1)) );
        return Vec_StrArray( vStr );
    }
    vSops0 = Vec_PtrAlloc( nVars + Exp_NodeNum(vExpr) );
    vSops1 = Vec_PtrAlloc( nVars + Exp_NodeNum(vExpr) );
    for ( i = 0; i < nVars; i++ )
    {
        Vec_PtrPush( vSops0, Mio_SopVar0(i) );
        Vec_PtrPush( vSops1, Mio_SopVar1(i) );
    }
    for ( i = 0; i < Exp_NodeNum(vExpr); i++ )
    {
        Index0  = Vec_IntEntry( vExpr, 2*i+0 ) >> 1;
        Index1  = Vec_IntEntry( vExpr, 2*i+1 ) >> 1;
        fCompl0 = Vec_IntEntry( vExpr, 2*i+0 ) & 1;
        fCompl1 = Vec_IntEntry( vExpr, 2*i+1 ) & 1;
        // positive polarity
        vSop = Mio_SopCoverAnd( fCompl0 ? (Vec_Int_t *)Vec_PtrEntry(vSops0, Index0) : (Vec_Int_t *)Vec_PtrEntry(vSops1, Index0),
                                fCompl1 ? (Vec_Int_t *)Vec_PtrEntry(vSops0, Index1) : (Vec_Int_t *)Vec_PtrEntry(vSops1, Index1) );
        Vec_PtrPush( vSops1, vSop );
        // negative polarity
        vSop = Mio_SopCoverOr( fCompl0 ? (Vec_Int_t *)Vec_PtrEntry(vSops1, Index0) : (Vec_Int_t *)Vec_PtrEntry(vSops0, Index0),
                               fCompl1 ? (Vec_Int_t *)Vec_PtrEntry(vSops1, Index1) : (Vec_Int_t *)Vec_PtrEntry(vSops0, Index1) );
        Vec_PtrPush( vSops0, vSop );
    }
    // complement
    if ( Vec_IntEntryLast(vExpr) & 1 )
    {
        vTemp  = vSops0;
        vSops0 = vSops1;
        vSops1 = vTemp;
    }
    // select the best polarity
    if ( Vec_IntSize( (Vec_Int_t *)Vec_PtrEntryLast(vSops0) ) < Vec_IntSize( (Vec_Int_t *)Vec_PtrEntryLast(vSops1) ) )
        vSop = (Vec_Int_t *)Vec_PtrEntryLast(vSops0);
    else
        vSop = (Vec_Int_t *)Vec_PtrEntryLast(vSops1);
    // convert positive polarity into SOP
    Mio_SopDeriveFromArray( vSop, nVars, vStr, (vSop == Vec_PtrEntryLast(vSops1)) );
    Vec_VecFree( (Vec_Vec_t *)vSops0 );
    Vec_VecFree( (Vec_Vec_t *)vSops1 );
    return Vec_StrArray( vStr );
}